

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O0

bool __thiscall libcellml::Model::hasUnlinkedUnits(Model *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  byte local_49;
  undefined1 local_30 [8];
  ComponentPtr c;
  size_t index;
  bool unlinkedUnits;
  Model *this_local;
  
  index._7_1_ = false;
  c.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  while( true ) {
    _Var1._M_pi = c.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                  ._M_pi;
    p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             ComponentEntity::componentCount(&this->super_ComponentEntity);
    local_49 = 0;
    if (_Var1._M_pi < p_Var2) {
      local_49 = index._7_1_ ^ 0xff;
    }
    if ((local_49 & 1) == 0) break;
    ComponentEntity::component((ComponentEntity *)local_30,(size_t)this);
    index._7_1_ = traverseComponentTreeForUnlinkedUnits((ComponentPtr *)local_30);
    std::shared_ptr<libcellml::Component>::~shared_ptr((shared_ptr<libcellml::Component> *)local_30)
    ;
    c.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         ((long)&(c.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi)->_vptr__Sp_counted_base + 1);
  }
  return index._7_1_;
}

Assistant:

bool Model::hasUnlinkedUnits()
{
    bool unlinkedUnits = false;
    for (size_t index = 0; index < componentCount() && !unlinkedUnits; ++index) {
        auto c = component(index);
        unlinkedUnits = traverseComponentTreeForUnlinkedUnits(c);
    }
    return unlinkedUnits;
}